

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O1

void __thiscall Imf_2_5::anon_unknown_7::LineBufferTask::execute(LineBufferTask *this)

{
  uint uVar1;
  int iVar2;
  PixelType PVar3;
  LineBuffer *pLVar4;
  PixelType *pPVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  Compression *pCVar9;
  Compressor *pCVar10;
  OutputStreamMutex *pOVar11;
  Data *pDVar12;
  ulong uVar13;
  Format FVar14;
  long lVar15;
  int y;
  uint y_00;
  LineBuffer *pLVar16;
  char *pcVar17;
  ulong uVar18;
  bool bVar19;
  char *readPtr;
  ulong local_48;
  long local_40;
  ulong local_38;
  
  pLVar16 = this->_lineBuffer;
  if ((pLVar16->buffer)._size == 0) {
    pDVar12 = this->_ofd;
    FVar14 = *(Format *)((long)&pLVar16->endOfLineBufferData + 4);
    if ((int)pDVar12->format < (int)FVar14) {
      FVar14 = pDVar12->format;
    }
    if ((int)FVar14 < *(int *)&pLVar16->endOfLineBufferData) {
      pcVar17 = (char *)0x0;
    }
    else {
      iVar7 = *(int *)((long)&(pDVar12->offsetInLineBuffer).
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage + 4);
      lVar15 = (long)(*(int *)&pLVar16->endOfLineBufferData - iVar7) + -1;
      pcVar17 = (char *)0x0;
      do {
        pcVar17 = pcVar17 + *(int *)((pDVar12->lineBuffers).
                                     super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start + lVar15 + 1);
        lVar15 = lVar15 + 1;
      } while (lVar15 < (int)(FVar14 - iVar7));
    }
    if (*(long **)&pLVar16->minY != (long *)0x0) {
      (**(code **)(**(long **)&pLVar16->minY + 8))();
    }
    pDVar12 = this->_ofd;
    iVar7 = *(int *)&this->_lineBuffer->endOfLineBufferData;
    if ((int)FVar14 < iVar7) {
      pLVar16 = (LineBuffer *)0x0;
    }
    else {
      iVar2 = *(int *)((long)&(pDVar12->offsetInLineBuffer).
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage + 4);
      lVar15 = (long)(iVar7 - iVar2) + -1;
      pLVar16 = (LineBuffer *)0x0;
      do {
        pLVar4 = (pDVar12->lineBuffers).
                 super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar15 + 1];
        if (pLVar16 < pLVar4) {
          pLVar16 = pLVar4;
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 < (int)(FVar14 - iVar2));
    }
    pCVar9 = Header::compression((Header *)
                                 &(pDVar12->header)._map._M_t._M_impl.super__Rb_tree_header.
                                  _M_node_count);
    pCVar10 = newCompressor(*pCVar9,(size_t)pLVar16,
                            (Header *)
                            &(this->_ofd->header)._map._M_t._M_impl.super__Rb_tree_header.
                             _M_node_count);
    pLVar16 = this->_lineBuffer;
    *(Compressor **)&pLVar16->minY = pCVar10;
    if ((pCVar10 == (Compressor *)0x0) || (pcVar17 <= pLVar16->dataPtr)) {
      pLVar16->scanLineMin = 1;
      (pLVar16->buffer)._size = (long)(pLVar16->buffer)._data;
    }
    else {
      iVar7 = (*pCVar10->_vptr_Compressor[3])(pCVar10);
      pLVar16 = this->_lineBuffer;
      pLVar16->scanLineMin = iVar7;
      iVar7 = (**(code **)(**(long **)&pLVar16->minY + 0x30))
                        (*(long **)&pLVar16->minY,(pLVar16->buffer)._data,
                         *(undefined4 *)&pLVar16->dataPtr,
                         *(undefined4 *)&pLVar16->endOfLineBufferData);
      this->_lineBuffer->dataPtr = (char *)(long)iVar7;
    }
  }
  uVar1 = *(uint *)&this[1].field_0x4 + 1;
  y_00 = *(uint *)(this + 1);
  uVar8 = y_00 - 1;
  bVar19 = *(int *)&(this->_ofd->offsetInLineBuffer).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish == 0;
  if (!bVar19) {
    y_00 = *(uint *)&this[1].field_0x4;
    uVar1 = uVar8;
  }
  if (y_00 != uVar1) {
    do {
      local_40 = (long)(int)y_00;
      readPtr = (char *)((this->_lineBuffer->buffer)._size +
                        *(long *)(*(long *)&this->_ofd->linesInBuffer +
                                 (local_40 -
                                 *(int *)((long)&(this->_ofd->offsetInLineBuffer).
                                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage
                                         + 4)) * 8));
      pDVar12 = this->_ofd;
      pOVar11 = pDVar12->_streamData;
      if (*(OutputStreamMutex **)&pDVar12->_deleteStream != pOVar11) {
        local_48 = (ulong)~y_00;
        uVar13 = 0;
        uVar18 = 1;
        do {
          pPVar5 = *(PixelType **)
                    ((long)&(pOVar11->super_Mutex).super___mutex_base._M_mutex + uVar13 * 8);
          PVar3 = pPVar5[0xd];
          if ((int)y_00 < 0) {
            if (-1 < (int)PVar3) {
              uVar8 = ((int)local_48 + PVar3) / PVar3;
              goto LAB_0059f6de;
            }
            uVar8 = (~PVar3 - y_00) / -PVar3;
          }
          else if ((int)PVar3 < 0) {
            uVar8 = y_00 / -PVar3;
LAB_0059f6de:
            uVar8 = -uVar8;
          }
          else {
            uVar8 = y_00 / PVar3;
          }
          if (y_00 == uVar8 * PVar3) {
            if (*(byte *)((long)pPVar5 + 0x39) == 1) {
              skipChannel(&readPtr,pPVar5[1],
                          (ulong)*(uint *)((long)pDVar12[1].frameBuffer._map._M_t._M_impl.
                                                 super__Rb_tree_header._M_header._M_left +
                                          (local_40 -
                                          *(int *)((long)&(pDVar12->offsetInLineBuffer).
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  + 4)) * 4));
            }
            else {
              uVar8 = *(uint *)&(pDVar12->offsetInLineBuffer).
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage;
              local_38 = (ulong)uVar8;
              iVar7 = *(int *)((long)&(pDVar12->offsetInLineBuffer).
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_finish + 4);
              lVar15 = (long)(int)(uVar8 - iVar7) + 1;
              copyIntoDeepFrameBuffer
                        (&readPtr,*(char **)(pPVar5 + 2),
                         (char *)(*(long *)&pDVar12[1].frameBuffer._map._M_t._M_impl.
                                            super__Rb_tree_header._M_header + (long)iVar7 * -4 +
                                 *(int *)((long)&(pDVar12->offsetInLineBuffer).
                                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage
                                         + 4) * lVar15 * -4),4,(long)(int)lVar15 << 2,y_00,iVar7,
                         uVar8,0,0,0,0,*(undefined8 *)(pPVar5 + 10),*(undefined8 *)(pPVar5 + 6),
                         *(undefined8 *)(pPVar5 + 8),SUB41(pPVar5[0xe],0),*(double *)(pPVar5 + 0x10)
                         ,this->_lineBuffer->scanLineMin,*pPVar5,pPVar5[1]);
            }
          }
          pDVar12 = this->_ofd;
          pOVar11 = pDVar12->_streamData;
          bVar6 = uVar18 < (ulong)(*(long *)&pDVar12->_deleteStream - (long)pOVar11 >> 3);
          uVar13 = uVar18;
          uVar18 = (ulong)((int)uVar18 + 1);
        } while (bVar6);
      }
      y_00 = y_00 + (uint)bVar19 * 2 + -1;
    } while (y_00 != uVar1);
  }
  return;
}

Assistant:

void
LineBufferTask::execute ()
{
    try
    {
        //
        // Uncompress the data, if necessary
        //

        if (_lineBuffer->uncompressedData == 0)
        {
            Int64 uncompressedSize = 0;
            int maxY = min (_lineBuffer->maxY, _ifd->maxY);

            for (int i = _lineBuffer->minY - _ifd->minY;
                 i <= maxY - _ifd->minY;
                 ++i)
            {
                uncompressedSize += (int) _ifd->bytesPerLine[i];
            }

            //
            // Create the compressor everytime when we want to use it,
            // because we don't know maxBytesPerLine beforehand.
            // (TODO) optimize this. don't do this every time.
            //

            if (_lineBuffer->compressor != 0)
                delete _lineBuffer->compressor;
            Int64 maxBytesPerLine = 0;
            for (int i = _lineBuffer->minY - _ifd->minY;
                 i <= maxY - _ifd->minY;
                 ++i)
            {
                if (_ifd->bytesPerLine[i] > maxBytesPerLine)
                    maxBytesPerLine = _ifd->bytesPerLine[i];
            }
            _lineBuffer->compressor = newCompressor(_ifd->header.compression(),
                                                    maxBytesPerLine,
                                                    _ifd->header);

            if (_lineBuffer->compressor &&
                _lineBuffer->packedDataSize < uncompressedSize)
            {
                _lineBuffer->format = _lineBuffer->compressor->format();

                _lineBuffer->packedDataSize = _lineBuffer->compressor->uncompress
                    (_lineBuffer->buffer, _lineBuffer->packedDataSize,
                     _lineBuffer->minY, _lineBuffer->uncompressedData);
            }
            else
            {
                //
                // If the line is uncompressed, it's in XDR format,
                // regardless of the compressor's output format.
                //

                _lineBuffer->format = Compressor::XDR;
                _lineBuffer->uncompressedData = _lineBuffer->buffer;
            }
        }

        int yStart, yStop, dy;

        if (_ifd->lineOrder == INCREASING_Y)
        {
            yStart = _scanLineMin;
            yStop = _scanLineMax + 1;
            dy = 1;
        }
        else
        {
            yStart = _scanLineMax;
            yStop = _scanLineMin - 1;
            dy = -1;
        }

        for (int y = yStart; y != yStop; y += dy)
        {
            //
            // Convert one scan line's worth of pixel data back
            // from the machine-independent representation, and
            // store the result in the frame buffer.
            //

            const char *readPtr = _lineBuffer->uncompressedData +
                                  _ifd->offsetInLineBuffer[y - _ifd->minY];

            //
            // Iterate over all image channels.
            //

            for (unsigned int i = 0; i < _ifd->slices.size(); ++i)
            {
                //
                // Test if scan line y of this channel contains any data
                // (the scan line contains data only if y % ySampling == 0).
                //

                InSliceInfo &slice = *_ifd->slices[i];

                if (modp (y, slice.ySampling) != 0)
                    continue;

                //
                // Find the x coordinates of the leftmost and rightmost
                // sampled pixels (i.e. pixels within the data window
                // for which x % xSampling == 0).
                //

                //
                // Fill the frame buffer with pixel data.
                //

                if (slice.skip)
                {
                    //
                    // The file contains data for this channel, but
                    // the frame buffer contains no slice for this channel.
                    //

                    skipChannel (readPtr, slice.typeInFile,
                                 _ifd->lineSampleCount[y - _ifd->minY]);
                }
                else
                {
                    //
                    // The frame buffer contains a slice for this channel.
                    //

                    int width = (_ifd->maxX - _ifd->minX + 1);

                    copyIntoDeepFrameBuffer (readPtr, slice.base,
                                             (char*) (&_ifd->sampleCount[0][0]
                                                      - _ifd->minX
                                                      - _ifd->minY * width),
                                             sizeof(unsigned int) * 1,
                                             sizeof(unsigned int) * width,
                                             y, _ifd->minX, _ifd->maxX,
                                             0, 0,
                                             0, 0,
                                             slice.sampleStride, 
                                             slice.xPointerStride,
                                             slice.yPointerStride,
                                             slice.fill,
                                             slice.fillValue, _lineBuffer->format,
                                             slice.typeInFrameBuffer,
                                             slice.typeInFile);
                }
            }
        }
    }
    catch (std::exception &e)
    {
        if (!_lineBuffer->hasException)
        {
            _lineBuffer->exception = e.what();
            _lineBuffer->hasException = true;
        }
    }
    catch (...)
    {
        if (!_lineBuffer->hasException)
        {
            _lineBuffer->exception = "unrecognized exception";
            _lineBuffer->hasException = true;
        }
    }
}